

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O3

void __thiscall crnlib::qdxt1::optimize_selectors_task(qdxt1 *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  dxt_pixel_block *pdVar2;
  byte bVar3;
  qdxt1 *pqVar4;
  bool bVar5;
  int iVar6;
  crn_thread_id_t cVar7;
  ulong uVar8;
  uint *puVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long *plVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  vector<unsigned_int> *pvVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  dxt1_block blk;
  color_quad_u8 colors [4];
  uint *apuStack_c8 [2];
  vector<unsigned_int> local_b8;
  vector<unsigned_int> local_a8;
  qdxt1 *local_98;
  long local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  uint local_70;
  int local_6c;
  ulong local_68;
  long local_60;
  color_quad_u8 local_58 [4];
  long *local_48;
  uint64 local_40;
  ulong local_38;
  
  local_a8.m_p = (uint *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_b8.m_p = (uint *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  apuStack_c8[1] = (uint *)0x1391f1;
  local_40 = data;
  vector<unsigned_int>::reserve(&local_b8,0x800);
  apuStack_c8[1] = (uint *)0x139203;
  vector<unsigned_int>::reserve(&local_a8,0x800);
  if (*(int *)(*pData_ptr + 8) != 0) {
    uVar23 = 0;
    local_98 = this;
    do {
      pqVar4 = local_98;
      if (local_98->m_canceled != false) break;
      if ((char)uVar23 == '\0') {
        apuStack_c8[1] = (uint *)0x13922c;
        cVar7 = crn_get_current_thread_id();
        if (cVar7 == pqVar4->m_main_thread_id) {
          apuStack_c8[1] = (uint *)0x139245;
          bVar5 = update_progress(pqVar4,(uint)uVar23,*(int *)(*pData_ptr + 8) - 1);
          if (!bVar5) break;
        }
      }
      uVar1 = pqVar4->m_pTask_pool->m_num_threads;
      if ((uVar1 == 0) || ((int)((uVar23 & 0xffffffff) % (ulong)(uVar1 + 1)) == (int)local_40)) {
        uVar8 = uVar23 * 0x10;
        if (1 < *(uint *)(**pData_ptr + 8 + uVar8)) {
          if (local_b8.m_size != 0) {
            local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
          }
          local_68 = uVar23;
          if (local_a8.m_size != 0) {
            local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
          }
          plVar15 = (long *)(**pData_ptr + uVar8);
          if ((int)plVar15[1] != 0) {
            uVar23 = 0;
            do {
              uVar13 = *(uint *)(*plVar15 + uVar23 * 4);
              uVar11 = local_98->m_elements_per_block * uVar13;
              if (*(ushort *)local_98->m_pDst_elements[uVar11].m_high_color <
                  *(ushort *)local_98->m_pDst_elements[uVar11].m_low_color) {
                if (local_b8.m_capacity <= local_b8.m_size) {
                  apuStack_c8[1] = (uint *)0x13930e;
                  elemental_vector::increase_capacity
                            ((elemental_vector *)&local_b8,local_b8.m_size + 1,true,4,
                             (object_mover)0x0,false);
                }
                pvVar20 = &local_b8;
                puVar9 = local_b8.m_p;
                uVar11 = local_b8.m_size;
              }
              else {
                uVar11 = (local_98->m_params).m_dxt1a_alpha_threshold;
                if (uVar11 != 0) {
                  lVar16 = 0;
                  do {
                    if (local_98->m_pBlocks[uVar13].m_pixels[0][lVar16].field_0.field_0.a < uVar11)
                    goto LAB_00139382;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 0x10);
                }
                uVar11 = local_a8.m_size;
                if (local_a8.m_capacity <= local_a8.m_size) {
                  apuStack_c8[1] = (uint *)0x13936c;
                  elemental_vector::increase_capacity
                            ((elemental_vector *)&local_a8,local_a8.m_size + 1,true,4,
                             (object_mover)0x0,false);
                  uVar11 = local_a8.m_size;
                }
                pvVar20 = &local_a8;
                puVar9 = local_a8.m_p;
              }
              puVar9[uVar11] = uVar13;
              pvVar20->m_size = pvVar20->m_size + 1;
LAB_00139382:
              uVar23 = uVar23 + 1;
              uVar8 = (ulong)*(uint *)(plVar15 + 1);
            } while (uVar23 < uVar8);
          }
          pqVar4 = local_98;
          local_78 = 0;
          uVar10 = CONCAT71((int7)(uVar8 >> 8),1);
          local_60 = 4;
          local_48 = (long *)pData_ptr;
          pvVar20 = &local_b8;
          uVar23 = local_68;
          do {
            local_70 = (uint)uVar10;
            uVar13 = pvVar20->m_size;
            uVar8 = (ulong)uVar13;
            if (1 < uVar13) {
              local_90 = 0;
              do {
                local_88 = 0;
                do {
                  local_80 = 0;
                  uVar18 = 0xffffffffff;
                  iVar21 = 0;
                  do {
                    if (uVar13 == 0) {
                      uVar13 = 0;
                      uVar17 = 0;
                    }
                    else {
                      local_38 = uVar18;
                      local_6c = iVar21;
                      uVar22 = 0;
                      uVar17 = 0;
                      do {
                        uVar13 = pvVar20->m_p[uVar22];
                        pdVar2 = pqVar4->m_pBlocks;
                        uVar11 = pqVar4->m_elements_per_block * uVar13;
                        apuStack_c8[1] = (uint *)0x13943d;
                        dxt1_block::get_block_colors
                                  (local_58,*(uint16 *)pqVar4->m_pDst_elements[uVar11].m_low_color,
                                   *(uint16 *)pqVar4->m_pDst_elements[uVar11].m_high_color);
                        iVar12 = (uint)pdVar2[uVar13].m_pixels[local_90][local_88].field_0.field_0.r
                                 - (uint)local_58[local_80].field_0.field_0.r;
                        iVar14 = (uint)pdVar2[uVar13].m_pixels[local_90][local_88].field_0.field_0.g
                                 - (uint)local_58[local_80].field_0.field_0.g;
                        iVar6 = (uint)pdVar2[uVar13].m_pixels[local_90][local_88].field_0.field_0.b
                                - (uint)local_58[local_80].field_0.field_0.b;
                        bVar5 = (pqVar4->m_params).m_perceptual == false;
                        iVar21 = iVar14 * 0x19;
                        if (bVar5) {
                          iVar21 = iVar14;
                        }
                        iVar19 = iVar12 * 8;
                        if (bVar5) {
                          iVar19 = iVar12;
                        }
                        uVar17 = uVar17 + (uint)(iVar6 * iVar6 + iVar19 * iVar12 + iVar21 * iVar14);
                        uVar22 = uVar22 + 1;
                        uVar13 = pvVar20->m_size;
                        uVar8 = (ulong)uVar13;
                        uVar18 = local_38;
                        uVar23 = local_68;
                        iVar21 = local_6c;
                      } while (uVar22 < uVar8);
                    }
                    if (uVar17 < uVar18) {
                      uVar18 = uVar17;
                      iVar21 = (int)local_80;
                    }
                    local_80 = local_80 + 1;
                  } while (local_80 != local_60);
                  bVar3 = (char)local_88 * '\x02';
                  *(byte *)((long)&local_78 + local_90 + 4) =
                       (byte)(iVar21 << (bVar3 & 0x1f)) |
                       ~(byte)(3 << (bVar3 & 0x1f)) & *(byte *)((long)&local_78 + local_90 + 4);
                  local_88 = local_88 + 1;
                } while (local_88 != 4);
                local_90 = local_90 + 1;
              } while (local_90 != 4);
              local_88 = 4;
              local_90 = 4;
              pData_ptr = local_48;
              if ((int)uVar8 != 0) {
                uVar8 = 0;
                do {
                  *(undefined4 *)
                   pqVar4->m_pDst_elements[pqVar4->m_elements_per_block * pvVar20->m_p[uVar8]].
                   m_selectors = local_78._4_4_;
                  uVar8 = uVar8 + 1;
                } while (uVar8 < pvVar20->m_size);
              }
            }
            local_60 = 3;
            pvVar20 = &local_a8;
            uVar10 = 0;
          } while ((local_70 & 1) != 0);
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < *(uint *)(*pData_ptr + 8));
  }
  lVar16 = 0x20;
  do {
    if (*(void **)((long)apuStack_c8 + lVar16) != (void *)0x0) {
      apuStack_c8[1] = (uint *)0x1395b7;
      crnlib_free(*(void **)((long)apuStack_c8 + lVar16));
    }
    lVar16 = lVar16 + -0x10;
  } while (lVar16 != 0);
  return;
}

Assistant:

void qdxt1::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt1_block& src_block = get_block(block_index);

                if (!src_block.is_alpha_block())
                {
                    block_categories[0].push_back(block_index);
                }
                else
                {
                    bool has_alpha_pixels = false;

                    if (m_params.m_dxt1a_alpha_threshold > 0)
                    {
                        const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            const color_quad_u8& src = pSrc_pixels[i];
                            if (src.a < m_params.m_dxt1a_alpha_threshold)
                            {
                                has_alpha_pixels = true;
                                break;
                            }
                        }
                    }

                    if (has_alpha_pixels)
                    {
                        continue;
                    }

                    block_categories[1].push_back(block_index);
                }
            }

            dxt1_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        uint max_s = 4;
                        if (block_type == 1)
                        {
                            max_s = 3;
                        }

                        for (uint s = 0; s < max_s; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt1_block& dst_block = get_block(block_index);

                                color_quad_u8 colors[4];
                                dxt1_block::get_block_colors(colors, static_cast<uint16>(dst_block.get_low_color()), static_cast<uint16>(dst_block.get_high_color()));

                                uint error = color::color_distance(m_params.m_perceptual, orig_color, colors[s], false);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt1_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }